

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul>::
SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,4ul>
          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul> *this,
          TypedID<(spirv_cross::Types)0> (*init) [4])

{
  undefined8 *puVar1;
  undefined8 uVar2;
  
  *(undefined8 *)(this + 8) = 0;
  *(SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul> **)this = this + 0x18;
  *(undefined8 *)(this + 0x10) = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::reserve
            ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)this,4);
  puVar1 = *(undefined8 **)this;
  uVar2 = *(undefined8 *)(*init + 2);
  *puVar1 = *(undefined8 *)*init;
  puVar1[1] = uVar2;
  *(undefined8 *)(this + 8) = 4;
  return;
}

Assistant:

explicit SmallVector(const U (&init)[M]) SPIRV_CROSS_NOEXCEPT : SmallVector(init, init + M)
	{
	}